

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_node_unlink(lys_node *node)

{
  LY_STMT stmt;
  lys_module *plVar1;
  lys_node *local_38;
  lys_module *main_module;
  lys_node **pp;
  lys_node *first;
  lys_node *parent;
  lys_node *node_local;
  
  main_module = (lys_module *)0x0;
  if (node != (lys_node *)0x0) {
    if ((node->module != (lys_module *)0x0) &&
       (plVar1 = lys_node_module(node), plVar1->data == node)) {
      plVar1->data = node->next;
    }
    first = node->parent;
    if ((first != (lys_node *)0x0) && (first->nodetype == LYS_AUGMENT)) {
      if (first->child == node) {
        if ((node->next == (lys_node *)0x0) || (node->next->parent != first)) {
          local_38 = (lys_node *)0x0;
        }
        else {
          local_38 = node->next;
        }
        first->child = local_38;
      }
      if ((first->flags & 1) == 0) {
        first = first->prev;
      }
      else {
        first = (lys_node *)0x0;
      }
    }
    if (first != (lys_node *)0x0) {
      if (first->nodetype == LYS_EXT) {
        stmt = lys_snode2stmt(node->nodetype);
        main_module = (lys_module *)
                      lys_ext_complex_get_substmt
                                (stmt,(lys_ext_instance_complex *)first,(lyext_substmt **)0x0);
        if (main_module->ctx == (ly_ctx *)node) {
          main_module->ctx = (ly_ctx *)node->next;
        }
      }
      else if (first->child == node) {
        first->child = node->next;
      }
      node->parent = (lys_node *)0x0;
    }
    if (node->prev != node) {
      if (node->next == (lys_node *)0x0) {
        pp = (lys_node **)node;
        if (first == (lys_node *)0x0) {
          while (pp[0xb]->next != (lys_node *)0x0) {
            pp = (lys_node **)pp[0xb];
          }
        }
        else if (first->nodetype == LYS_EXT) {
          pp = (lys_node **)main_module->ctx;
        }
        else {
          pp = (lys_node **)first->child;
        }
        pp[0xb] = node->prev;
      }
      else {
        node->next->prev = node->prev;
      }
      if (node->prev->next != (lys_node *)0x0) {
        node->prev->next = node->next;
      }
      node->next = (lys_node *)0x0;
      node->prev = node;
    }
  }
  return;
}

Assistant:

void
lys_node_unlink(struct lys_node *node)
{
    struct lys_node *parent, *first, **pp = NULL;
    struct lys_module *main_module;

    if (!node) {
        return;
    }

    /* unlink from data model if necessary */
    if (node->module) {
        /* get main module with data tree */
        main_module = lys_node_module(node);
        if (main_module->data == node) {
            main_module->data = node->next;
        }
    }

    /* store pointers to important nodes */
    parent = node->parent;
    if (parent && (parent->nodetype == LYS_AUGMENT)) {
        /* handle augments - first, unlink it from the augment parent ... */
        if (parent->child == node) {
            parent->child = (node->next && node->next->parent == parent) ? node->next : NULL;
        }

        if (parent->flags & LYS_NOTAPPLIED) {
            /* data are not connected in the target, so we cannot continue with the target as a parent */
            parent = NULL;
        } else {
            /* data are connected in target, so we will continue with the target as a parent */
            parent = ((struct lys_node_augment *)parent)->target;
        }
    }

    /* unlink from parent */
    if (parent) {
        if (parent->nodetype == LYS_EXT) {
            pp = (struct lys_node **)lys_ext_complex_get_substmt(lys_snode2stmt(node->nodetype),
                                                                 (struct lys_ext_instance_complex*)parent, NULL);
            if (*pp == node) {
                *pp = node->next;
            }
        } else if (parent->child == node) {
            parent->child = node->next;
        }
        node->parent = NULL;
    }

    /* unlink from siblings */
    if (node->prev == node) {
        /* there are no more siblings */
        return;
    }
    if (node->next) {
        node->next->prev = node->prev;
    } else {
        /* unlinking the last element */
        if (parent) {
            if (parent->nodetype == LYS_EXT) {
                first = *(struct lys_node **)pp;
            } else {
                first = parent->child;
            }
        } else {
            first = node;
            while (first->prev->next) {
                first = first->prev;
            }
        }
        first->prev = node->prev;
    }
    if (node->prev->next) {
        node->prev->next = node->next;
    }

    /* clean up the unlinked element */
    node->next = NULL;
    node->prev = node;
}